

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kinematics.cc
# Opt level: O1

void RigidBodyDynamics::CalcPointJacobian6D
               (Model *model,VectorNd *Q,uint body_id,Vector3d *point_position,MatrixNd *G,
               bool update_kinematics)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  uint uVar9;
  pointer pJVar10;
  pointer pSVar11;
  pointer ppCVar12;
  CustomJoint *pCVar13;
  pointer pMVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  undefined7 in_register_00000089;
  double dVar18;
  SrcEvaluatorType srcEvaluator;
  DstEvaluatorType dstEvaluator_1;
  SrcEvaluatorType srcEvaluator_1;
  DstEvaluatorType dstEvaluator;
  assign_op<double,_double> local_429;
  SpatialTransform *local_428;
  DstXprType local_420;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<const_Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_3,_0,_6,_3>,_0>,_6,_3,_false>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_3e8;
  undefined8 local_3c8;
  ulong local_3c0;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<const_Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,__1,__1,_false>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_3b8;
  DstEvaluatorType *local_398;
  double local_390;
  double local_388;
  SpatialTransform *local_380;
  double local_378;
  double local_370;
  double local_368;
  double local_360;
  double local_358;
  double local_350;
  double dStack_348;
  double local_340;
  undefined1 local_330 [24];
  SpatialTransform local_318;
  double local_2b8;
  double dStack_2b0;
  double local_2a8;
  double dStack_2a0;
  double local_298;
  double dStack_290;
  double local_288;
  double dStack_280;
  SpatialMatrix local_278;
  SpatialTransform local_158;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  SpatialTransform local_90;
  
  local_428 = (SpatialTransform *)G;
  if ((int)CONCAT71(in_register_00000089,update_kinematics) != 0) {
    UpdateKinematicsCustom(model,Q,(VectorNd *)0x0,(VectorNd *)0x0);
  }
  CalcBodyToBaseCoordinates(&local_90.r,model,Q,body_id,point_position,false);
  local_90.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[0] = 1.0;
  local_90.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[1] = 0.0;
  local_90.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[2] = 0.0;
  local_90.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[3] = 0.0;
  local_90.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[4] = 1.0;
  local_90.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[5] = 0.0;
  local_90.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[6] = 0.0;
  local_90.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[7] = 0.0;
  local_90.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[8] = 1.0;
  uVar15 = (ulong)(body_id - model->fixed_body_discriminator);
  if ((body_id != 0xffffffff && model->fixed_body_discriminator <= body_id) &&
     (uVar16 = ((long)(model->mFixedBodies).
                      super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                      .
                      super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(model->mFixedBodies).
                      super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                      .
                      super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x79435e50d79435e5,
     uVar15 <= uVar16 && uVar16 - uVar15 != 0)) {
    body_id = (model->mFixedBodies).
              super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
              .
              super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar15].mMovableParent;
  }
  for (; body_id != 0;
      body_id = (model->lambda).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start[body_id]) {
    pJVar10 = (model->mJoints).
              super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
              .
              super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
              ._M_impl.super__Vector_impl_data._M_start;
    dVar18 = (double)(ulong)pJVar10[body_id].q_index;
    if (pJVar10[body_id].mJointType == JointTypeCustom) {
      uVar9 = pJVar10[body_id].custom_joint_index;
      pSVar11 = (model->X_base).
                super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                .
                super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_318.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[1] = *(double *)((long)&pSVar11[body_id].E.super_Matrix3d + 0x18);
      local_318.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[2] = *(double *)((long)&pSVar11[body_id].E.super_Matrix3d + 0x30);
      local_318.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[0] = *(double *)&pSVar11[body_id].E.super_Matrix3d;
      local_318.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[3] = *(double *)((long)&pSVar11[body_id].E.super_Matrix3d + 8);
      local_318.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[4] = *(double *)((long)&pSVar11[body_id].E.super_Matrix3d + 0x20);
      local_318.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[5] = *(double *)((long)&pSVar11[body_id].E.super_Matrix3d + 0x38);
      local_318.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[6] = *(double *)((long)&pSVar11[body_id].E.super_Matrix3d + 0x10);
      local_318.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[7] = *(double *)((long)&pSVar11[body_id].E.super_Matrix3d + 0x28);
      local_318.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[8] = *(double *)((long)&pSVar11[body_id].E.super_Matrix3d + 0x40);
      dVar3 = *(double *)
               &pSVar11[body_id].r.super_Vector3d.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>;
      pdVar1 = (double *)((long)&pSVar11[body_id].E.super_Matrix3d + 0x18);
      dVar4 = *(double *)((long)&pSVar11[body_id].r.super_Vector3d + 8);
      pdVar2 = (double *)((long)&pSVar11[body_id].E.super_Matrix3d + 0x30);
      dVar5 = *(double *)((long)&pSVar11[body_id].r.super_Vector3d + 0x10);
      local_318.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
      m_storage.m_data.array[0] =
           (dVar3 * -*(double *)&pSVar11[body_id].E.super_Matrix3d - dVar4 * *pdVar1) -
           dVar5 * *pdVar2;
      local_318.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
      m_storage.m_data.array[1] =
           (dVar3 * -*(double *)((long)&pSVar11[body_id].E.super_Matrix3d + 8) - dVar4 * pdVar1[1])
           - dVar5 * pdVar2[1];
      local_318.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
      m_storage.m_data.array[2] =
           (-local_318.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
             .m_storage.m_data.array[8] * dVar5 -
           dVar4 * local_318.E.super_Matrix3d.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                   array[7]) -
           dVar3 * local_318.E.super_Matrix3d.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                   array[6];
      Math::SpatialTransform::operator*(&local_158,&local_90,(SpatialTransform *)(local_330 + 0x18))
      ;
      Math::SpatialTransform::toMatrix(&local_278,&local_158);
      ppCVar12 = (model->mCustomJoints).
                 super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pCVar13 = ppCVar12[uVar9];
      local_3c0 = (ulong)*(uint *)(pCVar13 + 8);
      local_3e8.m_src = (SrcEvaluatorType *)(pCVar13 + 0x70);
      local_3e8.m_functor = (assign_op<double,_double> *)0x0;
      local_3e8.m_dstExpr = (DstXprType *)0x0;
      local_3c8 = 6;
      local_368 = *(double *)((long)&(local_428->E).super_Matrix3d + 8);
      local_398 = (DstEvaluatorType *)
                  ((long)local_368 * (long)dVar18 * 8 + *(long *)&(local_428->E).super_Matrix3d);
      local_388 = (double)(ulong)*(uint *)(ppCVar12[uVar9] + 8);
      local_390 = 2.96439387504748e-323;
      local_380 = local_428;
      local_378 = 0.0;
      local_3e8.m_dst = (DstEvaluatorType *)&local_278;
      local_370 = dVar18;
      Eigen::internal::
      product_evaluator<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
      ::product_evaluator((product_evaluator<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                           *)&local_420,(XprType *)&local_3e8);
      local_420.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_xpr =
           (XprTypeNested)local_3e8.m_functor;
      local_420.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
      m_startRow.m_value = (long)local_3e8.m_dstExpr;
      local_420.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
      m_startCol.m_value =
           (long)&((Matrix3d *)&(local_3e8.m_functor)->field_0x0)->super_Matrix3d +
           (long)local_3e8.m_dstExpr * 6;
      local_330._0_8_ = local_398;
      local_330._16_8_ = *(double *)((long)&(local_380->E).super_Matrix3d + 8);
      local_3b8.m_dst = (DstEvaluatorType *)local_330;
      local_3b8.m_functor = &local_429;
      local_3b8.m_dstExpr = (DstXprType *)&local_398;
      local_3b8.m_src = (SrcEvaluatorType *)&local_420;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<const_Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_-1,_-1,_false>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
      ::run(&local_3b8);
      free((void *)local_420.
                   super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                   .m_rows.m_value);
    }
    else if (pJVar10[body_id].mDoFCount == 3) {
      pSVar11 = (model->X_base).
                super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                .
                super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_390 = *(double *)((long)&pSVar11[body_id].E.super_Matrix3d + 0x18);
      local_388 = *(double *)((long)&pSVar11[body_id].E.super_Matrix3d + 0x30);
      local_398 = *(DstEvaluatorType **)&pSVar11[body_id].E.super_Matrix3d;
      local_380 = *(SpatialTransform **)((long)&pSVar11[body_id].E.super_Matrix3d + 8);
      local_378 = *(double *)((long)&pSVar11[body_id].E.super_Matrix3d + 0x20);
      local_370 = *(double *)((long)&pSVar11[body_id].E.super_Matrix3d + 0x38);
      local_368 = *(double *)((long)&pSVar11[body_id].E.super_Matrix3d + 0x10);
      local_360 = *(double *)((long)&pSVar11[body_id].E.super_Matrix3d + 0x28);
      local_358 = *(double *)((long)&pSVar11[body_id].E.super_Matrix3d + 0x40);
      dVar3 = *(double *)
               &pSVar11[body_id].r.super_Vector3d.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>;
      pdVar1 = (double *)((long)&pSVar11[body_id].E.super_Matrix3d + 0x18);
      dVar4 = *(double *)((long)&pSVar11[body_id].r.super_Vector3d + 8);
      pdVar2 = (double *)((long)&pSVar11[body_id].E.super_Matrix3d + 0x30);
      dVar5 = *(double *)((long)&pSVar11[body_id].r.super_Vector3d + 0x10);
      local_350 = (dVar3 * -*(double *)&pSVar11[body_id].E.super_Matrix3d - dVar4 * *pdVar1) -
                  dVar5 * *pdVar2;
      dStack_348 = (dVar3 * -*(double *)((long)&pSVar11[body_id].E.super_Matrix3d + 8) -
                   dVar4 * pdVar1[1]) - dVar5 * pdVar2[1];
      local_340 = (-local_358 * dVar5 - dVar4 * local_360) - dVar3 * local_368;
      Math::SpatialTransform::operator*
                ((SpatialTransform *)(local_330 + 0x18),&local_90,(SpatialTransform *)&local_398);
      Math::SpatialTransform::toMatrix(&local_278,(SpatialTransform *)(local_330 + 0x18));
      pMVar14 = (model->multdof3_S).
                super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                .
                super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_420.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
      m_outerStride = *(Index *)((long)&(local_428->E).super_Matrix3d + 8);
      local_420.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_data
           = (PointerType)
             ((long)dVar18 *
              local_420.
              super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
              .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
              m_outerStride * 8 + *(long *)&(local_428->E).super_Matrix3d);
      local_420.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_rows
      .m_value = 6;
      local_420.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_cols
      .m_value = 3;
      local_420.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_xpr =
           (XprTypeNested)local_428;
      local_420.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
      m_startRow.m_value = 0;
      local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[0] = (double)((long)&local_158.E + 0x10);
      local_288 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                  array[0];
      dStack_280 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[1];
      local_298 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                  array[2];
      dStack_290 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[3];
      local_2a8 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                  array[4];
      dStack_2a0 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[5];
      local_2b8 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                  array[6];
      dStack_2b0 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[7];
      lVar17 = 0;
      do {
        dVar3 = *(double *)
                 ((long)&pMVar14[body_id].
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage +
                 lVar17);
        dVar4 = *(double *)
                 ((long)&pMVar14[body_id].
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage +
                 lVar17 + 8);
        dVar5 = *(double *)
                 ((long)&pMVar14[body_id].
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage +
                 lVar17 + 0x10);
        dVar6 = *(double *)
                 ((long)&pMVar14[body_id].
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage +
                 lVar17 + 0x18);
        dVar7 = *(double *)
                 ((long)&pMVar14[body_id].
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage +
                 lVar17 + 0x20);
        dVar8 = *(double *)
                 ((long)&pMVar14[body_id].
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage +
                 lVar17 + 0x28);
        *(double *)((long)&local_158.E + lVar17 + 0x10U) =
             dVar8 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x1e] +
             dVar7 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x18] +
             dVar6 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x12] +
             dVar5 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0xc] +
             dVar4 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[6] +
             dVar3 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0];
        *(double *)((long)&local_158.E + lVar17 + 0x18U) =
             dVar8 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x1f] +
             dVar7 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x19] +
             dVar6 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x13] +
             dVar5 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0xd] +
             dVar4 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[7] +
             dVar3 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[1];
        dVar3 = *(double *)
                 ((long)&pMVar14[body_id].
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage +
                 lVar17);
        dVar4 = *(double *)
                 ((long)&pMVar14[body_id].
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage +
                 lVar17 + 8);
        dVar5 = *(double *)
                 ((long)&pMVar14[body_id].
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage +
                 lVar17 + 0x10);
        dVar6 = *(double *)
                 ((long)&pMVar14[body_id].
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage +
                 lVar17 + 0x18);
        dVar7 = *(double *)
                 ((long)&pMVar14[body_id].
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage +
                 lVar17 + 0x20);
        dVar8 = *(double *)
                 ((long)&pMVar14[body_id].
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage +
                 lVar17 + 0x28);
        *(double *)((long)&local_158.E + lVar17 + 0x20U) =
             dVar8 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x20] +
             dVar7 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x1a] +
             dVar6 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x14] +
             dVar5 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0xe] +
             dVar4 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[8] +
             dVar3 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[2];
        *(double *)((long)&local_158.E + lVar17 + 0x28U) =
             dVar8 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x21] +
             dVar7 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x1b] +
             dVar6 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x15] +
             dVar5 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0xf] +
             dVar4 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[9] +
             dVar3 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[3];
        dVar3 = *(double *)
                 ((long)&pMVar14[body_id].
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage +
                 lVar17);
        dVar4 = *(double *)
                 ((long)&pMVar14[body_id].
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage +
                 lVar17 + 8);
        dVar5 = *(double *)
                 ((long)&pMVar14[body_id].
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage +
                 lVar17 + 0x10);
        dVar6 = *(double *)
                 ((long)&pMVar14[body_id].
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage +
                 lVar17 + 0x18);
        dVar7 = *(double *)
                 ((long)&pMVar14[body_id].
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage +
                 lVar17 + 0x20);
        dVar8 = *(double *)
                 ((long)&pMVar14[body_id].
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage +
                 lVar17 + 0x28);
        *(double *)((long)&local_158.E + lVar17 + 0x30U) =
             dVar8 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x22] +
             dVar7 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x1c] +
             dVar6 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x16] +
             dVar5 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x10] +
             dVar4 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[10] +
             dVar3 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[4];
        *(double *)((long)&local_158.E + lVar17 + 0x38U) =
             dVar8 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x23] +
             dVar7 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x1d] +
             dVar6 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x17] +
             dVar5 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x11] +
             dVar4 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0xb] +
             dVar3 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[5];
        lVar17 = lVar17 + 0x30;
      } while (lVar17 != 0x90);
      local_b8 = 0;
      uStack_b0 = 0;
      local_a8 = 0;
      local_3e8.m_dst = (DstEvaluatorType *)&local_3b8;
      local_3e8.m_src = (SrcEvaluatorType *)&local_158;
      local_3e8.m_functor = (assign_op<double,_double> *)local_330;
      local_3e8.m_dstExpr = &local_420;
      local_420.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
      m_startCol.m_value = (long)dVar18;
      local_3b8.m_dst =
           (DstEvaluatorType *)
           local_420.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
           m_data;
      local_3b8.m_functor =
           (assign_op<double,_double> *)
           local_420.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
           m_outerStride;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<const_Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_3,_0,_6,_3>,_0>,_6,_3,_false>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
      ::run(&local_3e8);
    }
    else if (pJVar10[body_id].mDoFCount == 1) {
      pSVar11 = (model->X_base).
                super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                .
                super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
           *(double *)((long)&pSVar11[body_id].E.super_Matrix3d + 0x18);
      local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] =
           *(double *)((long)&pSVar11[body_id].E.super_Matrix3d + 0x30);
      local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
           *(double *)&pSVar11[body_id].E.super_Matrix3d;
      local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] =
           *(double *)((long)&pSVar11[body_id].E.super_Matrix3d + 8);
      local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] =
           *(double *)((long)&pSVar11[body_id].E.super_Matrix3d + 0x20);
      local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[5] =
           *(double *)((long)&pSVar11[body_id].E.super_Matrix3d + 0x38);
      local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[6] =
           *(double *)((long)&pSVar11[body_id].E.super_Matrix3d + 0x10);
      local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[7] =
           *(double *)((long)&pSVar11[body_id].E.super_Matrix3d + 0x28);
      local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[8] =
           *(double *)((long)&pSVar11[body_id].E.super_Matrix3d + 0x40);
      dVar3 = *(double *)
               &pSVar11[body_id].r.super_Vector3d.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>;
      pdVar1 = (double *)((long)&pSVar11[body_id].E.super_Matrix3d + 0x18);
      dVar4 = *(double *)((long)&pSVar11[body_id].r.super_Vector3d + 8);
      pdVar2 = (double *)((long)&pSVar11[body_id].E.super_Matrix3d + 0x30);
      dVar5 = *(double *)((long)&pSVar11[body_id].r.super_Vector3d + 0x10);
      local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[9] =
           (dVar3 * -*(double *)&pSVar11[body_id].E.super_Matrix3d - dVar4 * *pdVar1) -
           dVar5 * *pdVar2;
      local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[10] =
           (dVar3 * -*(double *)((long)&pSVar11[body_id].E.super_Matrix3d + 8) - dVar4 * pdVar1[1])
           - dVar5 * pdVar2[1];
      local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0xb] =
           (-local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[8]
            * dVar5 -
           dVar4 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[7]) -
           dVar3 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[6];
      Math::SpatialTransform::apply
                ((SpatialTransform *)&local_278,
                 (model->S).
                 super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                 super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                 _M_impl.super__Vector_impl_data._M_start + body_id);
      Math::SpatialTransform::apply(&local_90,(SpatialVector *)&local_398);
      local_3e8.m_functor =
           *(assign_op<double,_double> **)((long)&(local_428->E).super_Matrix3d + 8);
      local_3e8.m_dst =
           (DstEvaluatorType *)
           ((long)dVar18 * (long)local_3e8.m_functor * 8 + *(long *)&(local_428->E).super_Matrix3d);
      local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[1] = 2.96439387504748e-323;
      local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[2] = 4.94065645841247e-324;
      local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[3] = (double)local_428;
      local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[4] = 0.0;
      local_420.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_data
           = (PointerType)&local_3e8;
      local_420.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_rows
      .m_value = (long)&local_3b8;
      local_420.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_cols
      .m_value = (long)local_330;
      local_420.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_xpr =
           (XprTypeNested)&local_158;
      local_3b8.m_dst = (DstEvaluatorType *)(local_330 + 0x18);
      local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[0] = (double)local_3e8.m_dst;
      local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[5] = dVar18;
      local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[6] = (double)local_3e8.m_functor;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_6,_1,_false>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_6,_1,_false>_>,_Eigen::internal::assign_op<double,_double>,_0>
             *)&local_420);
    }
  }
  return;
}

Assistant:

RBDL_DLLAPI void CalcPointJacobian6D (
    Model &model,
    const VectorNd &Q,
    unsigned int body_id,
    const Vector3d &point_position,
    MatrixNd &G,
    bool update_kinematics) {
  LOG << "-------- " << __func__ << " --------" << std::endl;

  // update the Kinematics if necessary
  if (update_kinematics) {
    UpdateKinematicsCustom (model, &Q, NULL, NULL);
  }

  SpatialTransform point_trans =
    SpatialTransform (Matrix3d::Identity(),
        CalcBodyToBaseCoordinates (model,
          Q,
          body_id,
          point_position,
          false));

  assert (G.rows() == 6 && G.cols() == model.qdot_size );

  unsigned int reference_body_id = body_id;

  if (model.IsFixedBodyId(body_id)) {
    unsigned int fbody_id = body_id - model.fixed_body_discriminator;
    reference_body_id = model.mFixedBodies[fbody_id].mMovableParent;
  }

  unsigned int j = reference_body_id;

  while (j != 0) {
    unsigned int q_index = model.mJoints[j].q_index;

    if(model.mJoints[j].mJointType != JointTypeCustom){
      if (model.mJoints[j].mDoFCount == 1) {
        G.block(0,q_index, 6, 1)
          = point_trans.apply(
              model.X_base[j].inverse().apply(
                model.S[j])).block<6, 1>(0,0);
      } else if (model.mJoints[j].mDoFCount == 3) {
        G.block(0, q_index, 6, 3)
          = ((point_trans
                * model.X_base[j].inverse()).toMatrix()
              * model.multdof3_S[j]).block<6, 3>(0,0);
      }
    } else {
      unsigned int k = model.mJoints[j].custom_joint_index;

      G.block(0, q_index, 6, model.mCustomJoints[k]->mDoFCount)
        = ((point_trans
              * model.X_base[j].inverse()).toMatrix()
            * model.mCustomJoints[k]->S).block(
              0,0,6,model.mCustomJoints[k]->mDoFCount);
    }

    j = model.lambda[j];
  }
}